

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void realloc_segmentation_maps(AV1_COMP *cpi)

{
  void *memblk;
  long lVar1;
  void *pvVar2;
  CYCLIC_REFRESH *pCVar3;
  size_t in_RDI;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  
  memblk = (void *)(in_RDI + 0x3bf80);
  lVar1 = in_RDI + 0x3c188;
  aom_free(memblk);
  pvVar2 = aom_calloc(in_RDI,(size_t)memblk);
  *(void **)(in_RDI + 0x71298) = pvVar2;
  if (*(long *)(in_RDI + 0x71298) == 0) {
    aom_internal_error(*(aom_internal_error_info **)((long)memblk + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cpi->enc_seg.map");
  }
  if (*(long *)(in_RDI + 0x712a8) != 0) {
    av1_cyclic_refresh_free((CYCLIC_REFRESH *)0x1288541);
  }
  pCVar3 = av1_cyclic_refresh_alloc((int)((ulong)lVar1 >> 0x20),(int)lVar1);
  *(CYCLIC_REFRESH **)(in_RDI + 0x712a8) = pCVar3;
  if (*(long *)(in_RDI + 0x712a8) == 0) {
    aom_internal_error(*(aom_internal_error_info **)((long)memblk + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cpi->cyclic_refresh");
  }
  aom_free(memblk);
  pvVar2 = aom_calloc(in_RDI,(size_t)memblk);
  *(void **)(in_RDI + 0x712b8) = pvVar2;
  if (*(long *)(in_RDI + 0x712b8) == 0) {
    aom_internal_error(*(aom_internal_error_info **)((long)memblk + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cpi->active_map.map");
  }
  return;
}

Assistant:

static inline void realloc_segmentation_maps(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  CommonModeInfoParams *const mi_params = &cm->mi_params;

  // Create the encoder segmentation map and set all entries to 0
  aom_free(cpi->enc_seg.map);
  CHECK_MEM_ERROR(cm, cpi->enc_seg.map,
                  aom_calloc(mi_params->mi_rows * mi_params->mi_cols, 1));

  // Create a map used for cyclic background refresh.
  if (cpi->cyclic_refresh) av1_cyclic_refresh_free(cpi->cyclic_refresh);
  CHECK_MEM_ERROR(
      cm, cpi->cyclic_refresh,
      av1_cyclic_refresh_alloc(mi_params->mi_rows, mi_params->mi_cols));

  // Create a map used to mark inactive areas.
  aom_free(cpi->active_map.map);
  CHECK_MEM_ERROR(cm, cpi->active_map.map,
                  aom_calloc(mi_params->mi_rows * mi_params->mi_cols, 1));
}